

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.cpp
# Opt level: O0

void DumpData(ostream *out,void *buffer,size_t len)

{
  _Setfill<char> _Var1;
  fmtflags __fmtfl;
  _Setw _Var2;
  ostream *poVar3;
  char local_a1;
  int local_5c;
  char ch;
  int i_2;
  int local_50;
  int i_1;
  int local_44;
  int i;
  ulong local_38;
  size_t index;
  uint8_t *data;
  fmtflags flags;
  size_t len_local;
  void *buffer_local;
  ostream *out_local;
  
  __fmtfl = std::ios_base::flags((ios_base *)(out + *(long *)(*(long *)out + -0x18)));
  index = (size_t)buffer;
  for (local_38 = 0; local_38 < len; local_38 = local_38 + 0x10) {
    poVar3 = (ostream *)std::ostream::operator<<(out,std::hex);
    _Var2 = std::setw(8);
    poVar3 = std::operator<<(poVar3,_Var2);
    _Var1 = std::setfill<char>('0');
    poVar3 = std::operator<<(poVar3,_Var1._M_c);
    std::ostream::operator<<(poVar3,local_38);
    for (local_44 = 0; local_44 < 8; local_44 = local_44 + 1) {
      if (local_38 + (long)local_44 < len) {
        poVar3 = std::operator<<(out," ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::hex);
        _Var2 = std::setw(2);
        poVar3 = std::operator<<(poVar3,_Var2);
        _Var1 = std::setfill<char>('0');
        poVar3 = std::operator<<(poVar3,_Var1._M_c);
        std::ostream::operator<<(poVar3,(uint)*(byte *)(index + (long)local_44));
      }
      else {
        std::operator<<(out,"   ");
      }
    }
    std::operator<<(out,"  ");
    for (local_50 = 8; local_50 < 0x10; local_50 = local_50 + 1) {
      if (local_38 + (long)local_50 < len) {
        poVar3 = std::operator<<(out," ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::hex);
        _Var2 = std::setw(2);
        poVar3 = std::operator<<(poVar3,_Var2);
        _Var1 = std::setfill<char>('0');
        poVar3 = std::operator<<(poVar3,_Var1._M_c);
        std::ostream::operator<<(poVar3,(uint)*(byte *)(index + (long)local_50));
      }
      else {
        std::operator<<(out,"   ");
      }
    }
    std::operator<<(out,"  ");
    for (local_5c = 0; local_5c < 0x10; local_5c = local_5c + 1) {
      if (local_38 + (long)local_5c < len) {
        local_a1 = *(char *)(index + (long)local_5c);
      }
      else {
        local_a1 = ' ';
      }
      if (local_a1 < ' ') {
        local_a1 = '.';
      }
      std::operator<<(out,local_a1);
    }
    std::operator<<(out,"\n");
    index = index + 0x10;
  }
  std::ios_base::flags((ios_base *)(out + *(long *)(*(long *)out + -0x18)),__fmtfl);
  return;
}

Assistant:

void DumpData(std::ostream& out, void* buffer, size_t len)
{
    std::ios_base::fmtflags flags = out.flags();
    const uint8_t* data = reinterpret_cast<const uint8_t*>(buffer);
    size_t index = 0;
    while (index < len)
    {
        out << std::hex << std::setw(8) << std::setfill('0') << index;
        for (int i = 0; i < 8; i++)
        {
            if (index + i < len)
            {
                out << " " << std::hex << std::setw(2) << std::setfill('0') << (uint32_t)data[i];
            }
            else
            {
                out << "   ";
            }
        }
        out << "  ";
        for (int i = 8; i < 16; i++)
        {
            if (index + i < len)
            {
                out << " " << std::hex << std::setw(2) << std::setfill('0') << (uint32_t)data[i];
            }
            else
            {
                out << "   ";
            }
        }
        out << "  ";
        for (int i = 0; i < 16; i++)
        {
            char ch = (index + i < len ? data[i] : ' ');
            out << ((ch < 32) ? '.' : ch);
        }
        out << "\n";
        data += 16;
        index += 16;
    }
    out.flags(flags);
}